

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extfilt.cc
# Opt level: O3

void __thiscall ExternalFilter::set_chip_model(ExternalFilter *this,chip_model model)

{
  sound_sample sVar1;
  
  sVar1 = 0x44601;
  if (model != MOS6581) {
    sVar1 = 0;
  }
  this->mixer_DC = sVar1;
  return;
}

Assistant:

void ExternalFilter::set_chip_model(chip_model model)
{
  if (model == MOS6581) {
    // Maximum mixer DC output level; to be removed if the external
    // filter is turned off: ((wave DC + voice DC)*voices + mixer DC)*volume
    // See voice.cc and filter.cc for an explanation of the values.
    mixer_DC = ((((0x800 - 0x380) + 0x800)*0xff*3 - 0xfff*0xff/18) >> 7)*0x0f;
  }
  else {
    // No DC offsets in the MOS8580.
    mixer_DC = 0;
  }
}